

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O0

cx_string<24UL> *
mserialize::cx_strcat<6ul,2ul,11ul,3ul,1ul,1ul>
          (cx_string<6UL> *strings,cx_string<2UL> *strings_1,cx_string<11UL> *strings_2,
          cx_string<3UL> *strings_3,cx_string<1UL> *strings_4,cx_string<1UL> *strings_5)

{
  cx_string<11UL> *in_RCX;
  cx_string<2UL> *in_RDX;
  cx_string<6UL> *in_RSI;
  cx_string<24UL> *in_RDI;
  cx_string<3UL> *in_R8;
  cx_string<1UL> *in_R9;
  cx_string<1UL> *in_stack_00000008;
  size_t s;
  size_t i;
  char *out;
  size_t size [7];
  char *data [7];
  char buffer [25];
  char *in_stack_ffffffffffffff20;
  ulong local_d8;
  char *local_d0;
  size_t local_c0 [7];
  char *local_88;
  data_ref local_80;
  data_ref local_78;
  data_ref local_70;
  data_ref local_68;
  data_ref local_60;
  data_ref local_58;
  char local_48 [32];
  cx_string<1UL> *local_28;
  cx_string<3UL> *local_20;
  cx_string<11UL> *local_18;
  cx_string<2UL> *local_10;
  cx_string<6UL> *local_8;
  
  local_28 = in_R9;
  local_20 = in_R8;
  local_18 = in_RCX;
  local_10 = in_RDX;
  local_8 = in_RSI;
  memset(local_48,0,0x19);
  local_88 = "";
  local_80 = cx_string<6UL>::data(local_8);
  local_78 = cx_string<2UL>::data(local_10);
  local_70 = cx_string<11UL>::data(local_18);
  local_68 = cx_string<3UL>::data(local_20);
  local_60 = cx_string<1UL>::data(local_28);
  local_58 = cx_string<1UL>::data(in_stack_00000008);
  local_c0[0] = cx_string<6UL>::size(local_8);
  local_c0[1] = cx_string<2UL>::size(local_10);
  local_c0[2] = cx_string<11UL>::size(local_18);
  local_c0[3] = cx_string<3UL>::size(local_20);
  local_c0[4] = cx_string<1UL>::size(local_28);
  local_c0[5] = cx_string<1UL>::size(in_stack_00000008);
  local_d0 = local_48;
  for (local_d8 = 1; local_d8 < 7; local_d8 = local_d8 + 1) {
    for (in_stack_ffffffffffffff20 = (char *)0x0;
        in_stack_ffffffffffffff20 < (cx_string<24UL> *)local_c0[local_d8 - 1];
        in_stack_ffffffffffffff20 = in_stack_ffffffffffffff20 + 1) {
      *local_d0 = in_stack_ffffffffffffff20[(long)(&local_88)[local_d8]];
      local_d0 = local_d0 + 1;
    }
  }
  cx_string<24UL>::cx_string((cx_string<24UL> *)in_stack_ffffffffffffff20,in_RDI->_data);
  return in_RDI;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}